

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O0

reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
__thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>
::
get_simplex_vertices<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
          (Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>
           *this,simplex_t idx,dimension_t dim,vertex_t n,
          reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *out)

{
  vertex_t vVar1;
  int iVar2;
  reference piVar3;
  simplex_t sVar4;
  undefined7 in_register_00000011;
  reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *in_R9;
  reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_40;
  char local_31;
  dimension_t k;
  reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *out_local;
  vertex_t n_local;
  dimension_t dim_local;
  simplex_t idx_local;
  Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>
  *this_local;
  
  _n_local = CONCAT71(in_register_00000011,dim);
  out_local._7_1_ = (char)n;
  out_local._0_4_ = (int)out + -1;
  idx_local = idx;
  this_local = (Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>
                *)this;
  for (local_31 = out_local._7_1_ + '\x01'; '\x01' < local_31; local_31 = local_31 + -1) {
    vVar1 = Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::get_max_vertex
                      ((Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_> *)
                       (idx + 0x30),_n_local,local_31,(vertex_t)out_local);
    out_local._0_4_ = vVar1;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
    ::operator++(&local_40,(int)in_R9);
    piVar3 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
             ::operator*(&local_40);
    *piVar3 = vVar1;
    sVar4 = Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::operator()
                      ((Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_> *)
                       (idx + 0x30),(vertex_t)out_local,local_31);
    _n_local = _n_local - sVar4;
  }
  iVar2 = (int)_n_local;
  piVar3 = std::
           reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
           ::operator*(in_R9);
  *piVar3 = iVar2;
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>::
  reverse_iterator((reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                    *)this,in_R9);
  return (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          )(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this;
}

Assistant:

OutputIterator get_simplex_vertices(simplex_t idx, const dimension_t dim, vertex_t n,
        OutputIterator out) const {
      --n;
      for (dimension_t k = dim + 1; k > 1; --k) {
        n = simplex_encoding.get_max_vertex(idx, k, n);
        *out++ = n;
        idx -= simplex_encoding(n, k);
      }
      *out = static_cast<vertex_t>(idx);
      return out;
    }